

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool r_exec::match(IPGMContext *input,IPGMContext *pattern)

{
  undefined4 uVar1;
  ushort uVar2;
  bool bVar3;
  uint16_t uVar4;
  ushort index;
  Atom *value;
  Atom local_cc [4];
  Atom local_c8 [6];
  uint16_t unused_index;
  IPGMContext guard_set;
  IPGMContext local_90;
  IPGMContext local_60;
  
  if ((input->super__Context).data == REFERENCE) {
    IPGMContext::addProduction(pattern,input->object,false);
    uVar1 = *(undefined4 *)&(pattern->super__Context).index;
    value = local_c8;
    r_code::Atom::ProductionPointer((ushort)value);
    _Context::patch_code(&pattern->super__Context,(short)uVar1 + 1,value);
  }
  else {
    uVar1 = *(undefined4 *)&(pattern->super__Context).index;
    value = local_cc;
    r_code::Atom::IPointer((ushort)value);
    _Context::patch_code(&pattern->super__Context,(short)uVar1 + 1,value);
  }
  r_code::Atom::~Atom(value);
  IPGMContext::getChild(&local_90,pattern,2);
  IPGMContext::operator*(&guard_set,&local_90);
  uVar4 = IPGMContext::getChildrenCount(&guard_set);
  uVar2 = 1;
  do {
    index = uVar2;
    if (uVar4 < index) break;
    IPGMContext::getChild(&local_60,&guard_set,index);
    IPGMContext::operator*(&local_90,&local_60);
    bVar3 = IPGMContext::evaluate_no_dereference(&local_90,&unused_index);
    uVar2 = index + 1;
  } while (bVar3);
  return uVar4 < index;
}

Assistant:

bool match(const IPGMContext &input, const IPGMContext &pattern)   // in red, patterns like (ptn object: [guards]) are allowed.
{
    // patch the pattern with a ptr to the input.
    if (input.is_reference()) {
        uint16_t ptr = pattern.addProduction(input.getObject(), false); // the object obviously is not new.
        pattern.patch_code(pattern.getIndex() + 1, Atom::ProductionPointer(ptr));
    } else {
        pattern.patch_code(pattern.getIndex() + 1, Atom::IPointer(input.getIndex()));
    }

    // evaluate the set of guards.
    IPGMContext guard_set = *pattern.getChild(2);
    uint16_t guard_count = guard_set.getChildrenCount();
    uint16_t unused_index;

    for (uint16_t i = 1; i <= guard_count; ++i) {
        if (!(*guard_set.getChild(i)).evaluate_no_dereference(unused_index)) { // WARNING: no check for duplicates.
            return false;
        }
    }

    return true;
}